

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,void **vtt)

{
  TPZGeoElSideIndex *pTVar1;
  undefined8 *in_RSI;
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *local_50;
  TPZGeoElSideIndex local_38;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  TPZGeoEl::TPZGeoEl(in_RDI,(void **)(in_RSI + 1));
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)(&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[3];
  pzgeom::TPZArc3D::TPZArc3D
            ((TPZArc3D *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  pTVar1 = (TPZGeoElSideIndex *)&in_RDI[10].fIndex;
  do {
    local_50 = pTVar1;
    TPZGeoElSideIndex::TPZGeoElSideIndex(local_50);
    pTVar1 = local_50 + 1;
  } while (local_50 + 1 != (TPZGeoElSideIndex *)&in_RDI[0xb].fNumInterfaces);
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(local_50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[10].fIndex + (long)iVar2 * 3),&local_38);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x18018b1);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}